

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O1

void skynet_globalmq_push(message_queue *queue)

{
  int iVar1;
  message_queue *pmVar2;
  global_queue *pgVar3;
  message_queue **ppmVar4;
  
  pgVar3 = Q;
  do {
    LOCK();
    iVar1 = (pgVar3->lock).lock;
    (pgVar3->lock).lock = 1;
    UNLOCK();
  } while (iVar1 != 0);
  if (queue->next == (message_queue *)0x0) {
    pmVar2 = pgVar3->tail;
    ppmVar4 = &pmVar2->next;
    if (pmVar2 == (message_queue *)0x0) {
      ppmVar4 = &pgVar3->tail;
    }
    *ppmVar4 = queue;
    (&pgVar3->head)[pmVar2 != (message_queue *)0x0] = queue;
    (pgVar3->lock).lock = 0;
    return;
  }
  __assert_fail("queue->next == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                ,0x30,"void skynet_globalmq_push(struct message_queue *)");
}

Assistant:

void 
skynet_globalmq_push(struct message_queue * queue) {
	struct global_queue *q= Q;

	SPIN_LOCK(q)
	assert(queue->next == NULL);
	if(q->tail) {
		q->tail->next = queue;
		q->tail = queue;
	} else {
		q->head = q->tail = queue;
	}
	SPIN_UNLOCK(q)
}